

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O1

hugeint_t duckdb::Hugeint::Multiply<true>(hugeint_t lhs,hugeint_t rhs)

{
  char cVar1;
  OutOfRangeException *this;
  int64_t in_RCX;
  uint64_t in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  hugeint_t hVar2;
  hugeint_t hVar3;
  hugeint_t result;
  hugeint_t local_90;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  hVar2.upper = in_RSI;
  hVar2.lower = in_RDI;
  hVar3.upper = in_RCX;
  hVar3.lower = in_RDX;
  cVar1 = duckdb::Hugeint::TryMultiply(hVar2,hVar3,&local_90);
  if (cVar1 != '\0') {
    return local_90;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Overflow in HUGEINT multiplication: %s + %s","");
  duckdb::hugeint_t::ToString_abi_cxx11_();
  duckdb::hugeint_t::ToString_abi_cxx11_();
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_80,&local_40,&local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static hugeint_t Multiply(hugeint_t lhs, hugeint_t rhs) {
		hugeint_t result;
		if (!TryMultiply(lhs, rhs, result)) {
			throw OutOfRangeException("Overflow in HUGEINT multiplication: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return result;
	}